

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zeCommandListImmediateAppendCommandListsExp
          (ze_command_list_handle_t hCommandListImmediate,uint32_t numCommandLists,
          ze_command_list_handle_t *phCommandLists,ze_event_handle_t hSignalEvent,
          uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  ze_result_t zVar1;
  
  if (DAT_0010e410 != (code *)0x0) {
    zVar1 = (*DAT_0010e410)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListImmediateAppendCommandListsExp(
        ze_command_list_handle_t hCommandListImmediate, ///< [in] handle of the immediate command list
        uint32_t numCommandLists,                       ///< [in] number of command lists
        ze_command_list_handle_t* phCommandLists,       ///< [in][range(0, numCommandLists)] handles of command lists
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
                                                        ///<    - if not null, this event is signaled after the completion of all
                                                        ///< appended command lists
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before executing appended
                                                        ///< command lists; must be 0 if nullptr == phWaitEvents
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before executing appended command lists.
                                                        ///<    - if not null, all wait events must be satisfied prior to the start
                                                        ///< of any appended command list(s)
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnImmediateAppendCommandListsExp = context.zeDdiTable.CommandListExp.pfnImmediateAppendCommandListsExp;
        if( nullptr != pfnImmediateAppendCommandListsExp )
        {
            result = pfnImmediateAppendCommandListsExp( hCommandListImmediate, numCommandLists, phCommandLists, hSignalEvent, numWaitEvents, phWaitEvents );
        }
        else
        {
            // generic implementation
        }

        return result;
    }